

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  long lVar1;
  secp256k1_sha256 *psVar2;
  ulong uVar3;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  secp256k1_fe sStack_c8;
  uchar *puStack_98;
  secp256k1_sha256 *psStack_90;
  uint32_t local_84;
  secp256k1_sha256 local_80;
  
  psVar2 = &local_80;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)psVar2->s = *(undefined8 *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar2 = (secp256k1_sha256 *)(psVar2->s + 2);
  }
  uVar3 = local_80.bytes >> 6;
  psStack_90 = (secp256k1_sha256 *)0x11bc21;
  local_84 = cnt;
  secp256k1_sha256_write(&local_80,(uchar *)&local_84,4);
  psStack_90 = (secp256k1_sha256 *)0x11bc2c;
  psVar2 = &local_80;
  secp256k1_sha256_finalize(&local_80,out32);
  if (local_80.bytes >> 6 == uVar3 + 1) {
    return;
  }
  psStack_90 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  puStack_98 = out32;
  psStack_90 = &local_80;
  secp256k1_fe_sqr(&sStack_c8,(secp256k1_fe *)psVar2);
  secp256k1_fe_mul(&sStack_c8,&sStack_c8,(secp256k1_fe *)psVar2);
  secp256k1_fe_verify(&sStack_c8);
  sStack_c8.n[0] = sStack_c8.n[0] + 2;
  sStack_c8.magnitude = sStack_c8.magnitude + 1;
  sStack_c8.normalized = 0;
  secp256k1_fe_verify(&sStack_c8);
  secp256k1_fe_is_square_var(&sStack_c8);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);

    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
}